

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter.cc
# Opt level: O0

bool __thiscall RaptorServerAdapter::Init(RaptorServerAdapter *this,RaptorOptions *options)

{
  bool bVar1;
  element_type *options_00;
  undefined8 uVar2;
  Status local_58;
  undefined1 local_28 [8];
  raptor_error e;
  RaptorOptions *options_local;
  RaptorServerAdapter *this_local;
  
  e._value = (Status *)options;
  options_00 = std::__shared_ptr_access<raptor::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<raptor::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->_impl);
  raptor::TcpServer::Init((TcpServer *)local_28,(RaptorOptions *)options_00);
  bVar1 = raptor::RefCountedPtr<raptor::Status>::operator!=
                    ((RefCountedPtr<raptor::Status> *)local_28,(nullptr_t)0x0);
  if (bVar1) {
    raptor::RefCountedPtr<raptor::Status>::operator->((RefCountedPtr<raptor::Status> *)local_28);
    raptor::Status::ToString_abi_cxx11_(&local_58);
    uVar2 = std::__cxx11::string::c_str();
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/adapter.cc"
               ,0x29,kLogLevelError,"server adapter: init (%s)",uVar2);
    std::__cxx11::string::~string((string *)&local_58);
  }
  this_local._7_1_ = !bVar1;
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_28);
  return this_local._7_1_;
}

Assistant:

bool RaptorServerAdapter::Init(const RaptorOptions* options) {
    raptor_error e = _impl->Init(options);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server adapter: init (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}